

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O3

int __thiscall
TPZFrontSym<std::complex<float>_>::Local(TPZFrontSym<std::complex<float>_> *this,int64_t global)

{
  int iVar1;
  _ComplexT in_RAX;
  long *plVar2;
  int iVar3;
  long lVar4;
  complex<float> local_28;
  
  plVar2 = (this->super_TPZFront<std::complex<float>_>).fLocal.fStore;
  lVar4 = plVar2[global];
  if (lVar4 == -1) {
    local_28._M_value = in_RAX;
    if ((this->super_TPZFront<std::complex<float>_>).fFree.super_TPZManVector<int,_10>.
        super_TPZVec<int>.fNElements == 0) {
      lVar4 = (this->super_TPZFront<std::complex<float>_>).fFront;
      (this->super_TPZFront<std::complex<float>_>).fFront = lVar4 + 1;
    }
    else {
      iVar1 = TPZStack<int,_10>::Pop(&(this->super_TPZFront<std::complex<float>_>).fFree);
      lVar4 = (long)iVar1;
      plVar2 = (this->super_TPZFront<std::complex<float>_>).fLocal.fStore;
    }
    plVar2[global] = lVar4;
    if ((this->super_TPZFront<std::complex<float>_>).fMaxFront <= lVar4) {
      iVar1 = (this->super_TPZFront<std::complex<float>_>).fExpandRatio;
      iVar3 = iVar1 + (int)lVar4;
      local_28._M_value = 0;
      TPZVec<std::complex<float>_>::Resize
                (&(this->super_TPZFront<std::complex<float>_>).fData,
                 (long)(((iVar1 + (int)lVar4 + 1) * iVar3) / 2),&local_28);
      (this->super_TPZFront<std::complex<float>_>).fMaxFront = iVar3;
    }
    if ((this->super_TPZFront<std::complex<float>_>).fGlobal.super_TPZVec<long>.fNElements <= lVar4)
    {
      TPZManVector<long,_10>::Resize
                (&(this->super_TPZFront<std::complex<float>_>).fGlobal,lVar4 + 1);
    }
    (this->super_TPZFront<std::complex<float>_>).fGlobal.super_TPZVec<long>.fStore[lVar4] = global;
  }
  return (int)lVar4;
}

Assistant:

void TPZFrontSym<std::complex<long double> >::DecomposeOneEquation(int64_t ieq, TPZEqnArray<std::complex<long double> > &eqnarray)
{
	DebugStop();
}